

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O1

int lws_hpack_dynamic_size(lws *wsi,int size)

{
  hpack_dt_entry *phVar1;
  ushort uVar2;
  ushort uVar3;
  lws_h2_netconn *plVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  undefined2 uVar8;
  lws *wsi_00;
  hpack_dt_entry *phVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  hpack_dt_entry *phVar14;
  uint uVar15;
  bool bVar16;
  
  uVar13 = (ulong)(uint)size;
  wsi_00 = lws_get_network_wsi(wsi);
  plVar4 = (wsi_00->h2).h2n;
  if (plVar4 != (lws_h2_netconn *)0x0) {
    _lws_log(8,"%s: from %d to %d, lim %u\n","lws_hpack_dynamic_size",
             (ulong)(plVar4->hpack_dyn_table).num_entries,uVar13,(ulong)(wsi_00->vhost->h2).set.s[1]
            );
    if (size == 0) {
      size = (uint)(plVar4->hpack_dyn_table).num_entries << 3;
      lws_hpack_destroy_dynamic_header(wsi);
    }
    if ((int)(wsi_00->vhost->h2).set.s[1] < size) {
      _lws_log(8,"rejecting hpack dyn size %u vs %u\n",(ulong)(uint)size);
      uVar12 = (wsi_00->vhost->h2).set.s[1];
      bVar16 = size == 0x10001;
      size = uVar12;
      if ((bVar16) && (uVar12 == 0x10000)) {
        lws_h2_goaway(wsi_00,9,"Asked for header table bigger than we told");
        uVar13 = 0x10001;
        goto LAB_0012e602;
      }
    }
    (plVar4->hpack_dyn_table).virtual_payload_max = size;
    uVar12 = size;
    if (size < 0) {
      uVar12 = size + 7U;
    }
    uVar12 = (int)uVar12 >> 3;
    uVar13 = (ulong)uVar12;
    uVar2 = (plVar4->hpack_dyn_table).num_entries;
    if (uVar12 == uVar2) {
      return 0;
    }
    uVar3 = (plVar4->hpack_dyn_table).used_entries;
    uVar15 = (uint)uVar3;
    if ((int)uVar12 < (int)(uint)uVar3) {
      uVar15 = uVar12;
    }
    if ((int)(uint)uVar2 <= (int)uVar15) {
      uVar15 = (uint)uVar2;
    }
    phVar9 = (hpack_dt_entry *)lws_zalloc((long)(int)uVar12 * 0x10 + 0x10,"dynamic table entries");
    if (phVar9 != (hpack_dt_entry *)0x0) {
      while (((uVar10 = (plVar4->hpack_dyn_table).virtual_payload_usage, uVar10 != 0 &&
              (uVar2 = (plVar4->hpack_dyn_table).used_entries, uVar2 != 0)) &&
             ((plVar4->hpack_dyn_table).virtual_payload_max < uVar10))) {
        uVar10 = (uint)(plVar4->hpack_dyn_table).num_entries;
        iVar11 = (int)((uint)(plVar4->hpack_dyn_table).pos - (uint)uVar2) % (int)uVar10;
        lws_dynamic_free(&plVar4->hpack_dyn_table,(iVar11 >> 0x1f & uVar10) + iVar11);
      }
      uVar2 = (plVar4->hpack_dyn_table).used_entries;
      uVar10 = (uint)uVar2;
      if ((int)uVar15 < (int)(uint)uVar2) {
        uVar10 = uVar15;
      }
      if ((plVar4->hpack_dyn_table).entries != (hpack_dt_entry *)0x0) {
        if (0 < (int)uVar10) {
          uVar13 = 0;
          phVar14 = phVar9;
          do {
            uVar15 = (uint)(plVar4->hpack_dyn_table).num_entries;
            iVar11 = (int)(((uint)(plVar4->hpack_dyn_table).pos -
                           (uint)(plVar4->hpack_dyn_table).used_entries) + (int)uVar13) %
                     (int)uVar15;
            phVar1 = (plVar4->hpack_dyn_table).entries + (int)((iVar11 >> 0x1f & uVar15) + iVar11);
            uVar5 = phVar1->value_len;
            uVar6 = phVar1->hdr_len;
            uVar7 = phVar1->lws_hdr_idx;
            uVar8 = *(undefined2 *)&phVar1->field_0xe;
            phVar14->value = phVar1->value;
            phVar14->value_len = uVar5;
            phVar14->hdr_len = uVar6;
            phVar14->lws_hdr_idx = uVar7;
            *(undefined2 *)&phVar14->field_0xe = uVar8;
            uVar13 = uVar13 + 1;
            phVar14 = phVar14 + 1;
          } while (uVar10 != uVar13);
        }
        lws_realloc((plVar4->hpack_dyn_table).entries,0,"lws_free");
      }
      (plVar4->hpack_dyn_table).entries = phVar9;
      (plVar4->hpack_dyn_table).num_entries = (uint16_t)uVar12;
      (plVar4->hpack_dyn_table).used_entries = (uint16_t)uVar10;
      if (size + 7U < 0xf) {
        (plVar4->hpack_dyn_table).pos = 0;
        return 0;
      }
      (plVar4->hpack_dyn_table).pos = (uint16_t)((int)uVar10 % (int)uVar12);
      return 0;
    }
  }
LAB_0012e602:
  _lws_log(8,"%s: failed to resize to %d\n","lws_hpack_dynamic_size",uVar13);
  return 1;
}

Assistant:

int
lws_hpack_dynamic_size(struct lws *wsi, int size)
{
	struct hpack_dynamic_table *dyn;
	struct hpack_dt_entry *dte;
	struct lws *nwsi;
	int min, n = 0, m;

	/*
	 * "size" here is coming from the http/2 SETTING
	 * SETTINGS_HEADER_TABLE_SIZE.  This is a (virtual, in our case)
	 * linear buffer containing dynamic header names and values... when it
	 * is full, old entries are evicted.
	 *
	 * We encode the header as an lws_hdr_idx, which is all the rest of
	 * lws cares about; if there is no matching header we store an empty
	 * entry in the dyn table as a placeholder.
	 *
	 * So to make the two systems work together we keep an accounting of
	 * what we are using to decide when to evict... we must only evict
	 * things when the remote peer's accounting also makes him feel he
	 * should evict something.
	 */

	nwsi = lws_get_network_wsi(wsi);
	if (!nwsi->h2.h2n)
		goto bail;

	dyn = &nwsi->h2.h2n->hpack_dyn_table;
	lwsl_info("%s: from %d to %d, lim %u\n", __func__,
		  (int)dyn->num_entries, size,
		  (unsigned int)nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE]);

	if (!size) {
		size = dyn->num_entries * 8;
		lws_hpack_destroy_dynamic_header(wsi);
	}

	if (size > (int)nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE]) {
		lwsl_info("rejecting hpack dyn size %u vs %u\n", size,
			  (unsigned int)nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE]);

		// this seems necessary to work with some browsers

		if (nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE] == 65536 &&
				size == 65537) { /* h2spec */
			lws_h2_goaway(nwsi, H2_ERR_COMPRESSION_ERROR,
				  "Asked for header table bigger than we told");
			goto bail;
		}

		size = nwsi->vhost->h2.set.s[H2SET_HEADER_TABLE_SIZE];
	}

	dyn->virtual_payload_max = size;

	size = size / 8;
	min = size;
	if (min > dyn->used_entries)
		min = dyn->used_entries;

	if (size == dyn->num_entries)
		return 0;

	if (dyn->num_entries < min)
		min = dyn->num_entries;

	// lwsl_notice("dte requested size %d\n", size);

	dte = lws_zalloc(sizeof(*dte) * (size + 1), "dynamic table entries");
	if (!dte)
		goto bail;

	while (dyn->virtual_payload_usage && dyn->used_entries &&
	       dyn->virtual_payload_usage > dyn->virtual_payload_max) {
		n = (dyn->pos - dyn->used_entries) % dyn->num_entries;
		if (n < 0)
			n += dyn->num_entries;
		lws_dynamic_free(dyn, n);
	}

	if (min > dyn->used_entries)
		min = dyn->used_entries;

	if (dyn->entries) {
		for (n = 0; n < min; n++) {
			m = (dyn->pos - dyn->used_entries + n) %
						dyn->num_entries;
			if (m < 0)
				m += dyn->num_entries;
			dte[n] = dyn->entries[m];
		}

		lws_free(dyn->entries);
	}

	dyn->entries = dte;
	dyn->num_entries = size;
	dyn->used_entries = min;
	if (size)
		dyn->pos = min % size;
	else
		dyn->pos = 0;

	lws_h2_dynamic_table_dump(wsi);

	return 0;

bail:
	lwsl_info("%s: failed to resize to %d\n", __func__, size);

	return 1;
}